

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  int32 iVar5;
  uint32 uVar6;
  Descriptor *pDVar7;
  ExtensionSet *this_00;
  int64 iVar8;
  long *plVar9;
  uint *puVar10;
  uint64 uVar11;
  unsigned_long *puVar12;
  float *pfVar13;
  double *pdVar14;
  bool *pbVar15;
  EnumValueDescriptor *this_01;
  int *piVar16;
  FieldOptions *pFVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar18;
  Message **ppMVar19;
  RepeatedField<long> *this_02;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<unsigned_long> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<float> *this_06;
  RepeatedField<bool> *this_07;
  RepeatedField<int> *pRVar20;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_08;
  RepeatedPtrFieldBase *this_09;
  float fVar21;
  double dVar22;
  string **value;
  string *default_ptr;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar7 = FieldDescriptor::containing_type(field);
  if (pDVar7 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  bVar2 = FieldDescriptor::is_extension(field);
  if (bVar2) {
    this_00 = MutableExtensionSet(this,message);
    iVar3 = FieldDescriptor::number(field);
    ExtensionSet::ClearExtension(this_00,iVar3);
  }
  else {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      CVar4 = FieldDescriptor::cpp_type(field);
      switch(CVar4) {
      case CPPTYPE_INT32:
        pRVar20 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        RepeatedField<int>::Clear(pRVar20);
        break;
      case CPPTYPE_INT64:
        this_02 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
        RepeatedField<long>::Clear(this_02);
        break;
      case CPPTYPE_UINT32:
        this_03 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
        RepeatedField<unsigned_int>::Clear(this_03);
        break;
      case CPPTYPE_UINT64:
        this_04 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
        RepeatedField<unsigned_long>::Clear(this_04);
        break;
      case CPPTYPE_DOUBLE:
        this_05 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
        RepeatedField<double>::Clear(this_05);
        break;
      case CPPTYPE_FLOAT:
        this_06 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
        RepeatedField<float>::Clear(this_06);
        break;
      case CPPTYPE_BOOL:
        this_07 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
        RepeatedField<bool>::Clear(this_07);
        break;
      case CPPTYPE_ENUM:
        pRVar20 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        RepeatedField<int>::Clear(pRVar20);
        break;
      case CPPTYPE_STRING:
        pFVar17 = FieldDescriptor::options(field);
        FieldOptions::ctype(pFVar17);
        this_08 = MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            (this,message,field);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Clear(this_08);
        break;
      case CPPTYPE_MESSAGE:
        this_09 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this_09);
      }
    }
    else {
      bVar2 = HasBit(this,message,field);
      if (bVar2) {
        ClearBit(this,message,field);
        CVar4 = FieldDescriptor::cpp_type(field);
        switch(CVar4) {
        case CPPTYPE_INT32:
          iVar5 = FieldDescriptor::default_value_int32(field);
          piVar16 = MutableRaw<int>(this,message,field);
          *piVar16 = iVar5;
          break;
        case CPPTYPE_INT64:
          iVar8 = FieldDescriptor::default_value_int64(field);
          plVar9 = MutableRaw<long>(this,message,field);
          *plVar9 = iVar8;
          break;
        case CPPTYPE_UINT32:
          uVar6 = FieldDescriptor::default_value_uint32(field);
          puVar10 = MutableRaw<unsigned_int>(this,message,field);
          *puVar10 = uVar6;
          break;
        case CPPTYPE_UINT64:
          uVar11 = FieldDescriptor::default_value_uint64(field);
          puVar12 = MutableRaw<unsigned_long>(this,message,field);
          *puVar12 = uVar11;
          break;
        case CPPTYPE_DOUBLE:
          dVar22 = FieldDescriptor::default_value_double(field);
          pdVar14 = MutableRaw<double>(this,message,field);
          *pdVar14 = dVar22;
          break;
        case CPPTYPE_FLOAT:
          fVar21 = FieldDescriptor::default_value_float(field);
          pfVar13 = MutableRaw<float>(this,message,field);
          *pfVar13 = fVar21;
          break;
        case CPPTYPE_BOOL:
          bVar2 = FieldDescriptor::default_value_bool(field);
          pbVar15 = MutableRaw<bool>(this,message,field);
          *pbVar15 = bVar2;
          break;
        case CPPTYPE_ENUM:
          this_01 = FieldDescriptor::default_value_enum(field);
          iVar3 = EnumValueDescriptor::number(this_01);
          piVar16 = MutableRaw<int>(this,message,field);
          *piVar16 = iVar3;
          break;
        case CPPTYPE_STRING:
          pFVar17 = FieldDescriptor::options(field);
          FieldOptions::ctype(pFVar17);
          ppbVar18 = DefaultRaw<std::__cxx11::string_const*>(this,field);
          pbVar1 = *ppbVar18;
          ppbVar18 = MutableRaw<std::__cxx11::string*>(this,message,field);
          if (*ppbVar18 != pbVar1) {
            bVar2 = FieldDescriptor::has_default_value(field);
            if (bVar2) {
              pbVar1 = *ppbVar18;
              FieldDescriptor::default_value_string_abi_cxx11_(field);
              std::__cxx11::string::assign((string *)pbVar1);
            }
            else {
              std::__cxx11::string::clear();
            }
          }
          break;
        case CPPTYPE_MESSAGE:
          ppMVar19 = MutableRaw<google::protobuf::Message*>(this,message,field);
          (*((*ppMVar19)->super_MessageLite)._vptr_MessageLite[4])();
        }
      }
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              const string* default_ptr = DefaultRaw<const string*>(field);
              string** value = MutableRaw<string*>(message, field);
              if (*value != default_ptr) {
                if (field->has_default_value()) {
                  (*value)->assign(field->default_value_string());
                } else {
                  (*value)->clear();
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We don't know which subclass of RepeatedPtrFieldBase the type is,
        // so we use RepeatedPtrFieldBase directly.
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->Clear<GenericTypeHandler<Message> >();
        break;
      }
    }
  }
}